

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void pnga_sprs_array_access_col_block(Integer s_a,Integer icol,void *idx,void *jdx,void *val)

{
  long lVar1;
  long lVar2;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  Integer offset;
  Integer me;
  Integer ld;
  Integer hi;
  Integer lo;
  char *lptr_1;
  int64_t *tljdx;
  int64_t *tlidx;
  int *tjdx;
  int *tidx;
  Integer longidx;
  Integer index;
  Integer i;
  char *lptr;
  Integer hdl;
  Integer *in_stack_00000268;
  Integer *in_stack_00000270;
  Integer in_stack_00000278;
  Integer in_stack_00000280;
  Integer *in_stack_00000340;
  void *in_stack_00000348;
  Integer *in_stack_00000350;
  Integer *in_stack_00000358;
  Integer in_stack_00000360;
  Integer local_88;
  Integer local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  
  local_30 = in_RDI + 1000;
  local_50 = (ulong)(SPA[local_30].idx_size == 8);
  local_48 = -1;
  local_40 = 0;
  do {
    if (SPA[local_30].nblocks <= local_40) {
LAB_001a6b61:
      if (local_48 == -1) {
        if (local_50 == 0) {
          *in_RDX = 0;
          *in_RCX = 0;
        }
        else {
          *in_RDX = 0;
          *in_RCX = 0;
        }
        *in_R8 = 0;
      }
      else {
        local_28 = in_R8;
        local_20 = in_RCX;
        local_18 = in_RDX;
        pnga_pgroup_nodeid(SPA[local_30].grp);
        lVar1 = SPA[local_30].offset[local_48];
        pnga_distribution(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
        pnga_access_ptr(in_stack_00000360,in_stack_00000358,in_stack_00000350,in_stack_00000348,
                        in_stack_00000340);
        pnga_distribution(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
        if (local_50 == 0) {
          pnga_access_ptr(in_stack_00000360,in_stack_00000358,in_stack_00000350,in_stack_00000348,
                          in_stack_00000340);
        }
        else {
          pnga_access_ptr(in_stack_00000360,in_stack_00000358,in_stack_00000350,in_stack_00000348,
                          in_stack_00000340);
        }
        pnga_distribution(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
        if (local_50 == 0) {
          pnga_access_ptr(in_stack_00000360,in_stack_00000358,in_stack_00000350,in_stack_00000348,
                          in_stack_00000340);
        }
        else {
          pnga_access_ptr(in_stack_00000360,in_stack_00000358,in_stack_00000350,in_stack_00000348,
                          in_stack_00000340);
        }
        lVar2 = (SPA[local_30].ihi - SPA[local_30].ilo) + 2;
        local_78 = local_78 + lVar1 * SPA[local_30].size;
        if (local_50 == 0) {
          local_60 = local_60 + (long)(int)lVar1 * 4;
          local_58 = local_58 + (long)((int)lVar2 * (int)local_48) * 4;
          *local_18 = local_58;
          *local_20 = local_60;
        }
        else {
          local_70 = local_70 + lVar1 * 8;
          local_68 = local_68 + lVar2 * local_48 * 8;
          *local_18 = local_68;
          *local_20 = local_70;
        }
        *local_28 = local_78;
        pnga_release(SPA[local_30].g_data,&local_80,&local_88);
        pnga_release(SPA[local_30].g_i,&local_80,&local_88);
        pnga_release(SPA[local_30].g_j,&local_80,&local_88);
      }
      return;
    }
    if (SPA[local_30].blkidx[local_40] == in_RSI) {
      local_48 = local_40;
      goto LAB_001a6b61;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void pnga_sprs_array_access_col_block(Integer s_a, Integer icol,
    void *idx, void *jdx, void *val)
{
  Integer hdl = GA_OFFSET + s_a;
  char *lptr;
  Integer i,index;
  Integer longidx;
  if (SPA[hdl].idx_size == sizeof(int64_t)) {
    longidx = 1;
  } else {
    longidx = 0;
  }
  index = -1;
  for (i=0; i<SPA[hdl].nblocks; i++) {
    if (SPA[hdl].blkidx[i] == icol) {
      index = i;
      break;
    }
  }
  if (index == -1) {
    if (longidx) {
      *(int**)idx = NULL;
      *(int**)jdx = NULL;
    } else {
      *(int64_t**)idx = NULL;
      *(int64_t**)jdx = NULL;
    }
    *(char**)val = NULL;
  }  else {
    int *tidx;
    int *tjdx;
    int64_t *tlidx;
    int64_t *tljdx;
    char *lptr;
    Integer lo, hi, ld;
    Integer me = pnga_pgroup_nodeid(SPA[hdl].grp);
    Integer offset = SPA[hdl].offset[index];

    /* access local portions of GAs containing data */
    pnga_distribution(SPA[hdl].g_data,me,&lo,&hi);
    pnga_access_ptr(SPA[hdl].g_data,&lo,&hi,&lptr,&ld);
    pnga_distribution(SPA[hdl].g_i,me,&lo,&hi);
    if (longidx) {
      pnga_access_ptr(SPA[hdl].g_i,&lo,&hi,&tlidx,&ld);
    } else {
      pnga_access_ptr(SPA[hdl].g_i,&lo,&hi,&tidx,&ld);
    }
    pnga_distribution(SPA[hdl].g_j,me,&lo,&hi);
    if (longidx) {
      pnga_access_ptr(SPA[hdl].g_j,&lo,&hi,&tljdx,&ld);
    } else {
      pnga_access_ptr(SPA[hdl].g_j,&lo,&hi,&tjdx,&ld);
    }
    /* shift pointers to correct location */
    ld = SPA[hdl].ihi - SPA[hdl].ilo + 2;
    lptr = lptr + offset*SPA[hdl].size;
    if (longidx) {
      tljdx = tljdx + (int64_t)offset;
      tlidx = tlidx + (int64_t)(ld*index);
      *(int64_t**)idx = tlidx;
      *(int64_t**)jdx = tljdx;
    } else {
      tjdx = tjdx + (int)offset;
      tidx = tidx + (int)(ld*index);
      *(int**)idx = tidx;
      *(int**)jdx = tjdx;
    }
    *(char**)val = lptr;
    pnga_release(SPA[hdl].g_data,&lo,&hi);
    pnga_release(SPA[hdl].g_i,&lo,&hi);
    pnga_release(SPA[hdl].g_j,&lo,&hi);
  }
}